

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::reg(int paren,int *flagp)

{
  char cVar1;
  char *pcVar2;
  char local_44;
  uint local_40;
  int local_3c;
  int flags;
  int parno;
  char *ender;
  char *br;
  char *ret;
  int *flagp_local;
  char *pcStack_10;
  int paren_local;
  
  local_3c = 0;
  *flagp = 1;
  ret = (char *)flagp;
  flagp_local._4_4_ = paren;
  if (paren == 0) {
    br = (char *)0x0;
  }
  else {
    if (9 < regnpar) {
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return (char *)0x0;
    }
    local_3c = regnpar;
    cVar1 = (char)regnpar;
    regnpar = regnpar + 1;
    br = regnode(cVar1 + '\x14');
  }
  ender = regbranch((int *)&local_40);
  if (ender == (char *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    pcVar2 = ender;
    if (br != (char *)0x0) {
      regtail(br,ender);
      pcVar2 = br;
    }
    br = pcVar2;
    if ((local_40 & 1) == 0) {
      *(uint *)ret = *(uint *)ret & 0xfffffffe;
    }
    *(uint *)ret = local_40 & 4 | *(uint *)ret;
    while (*regparse == '|') {
      regparse = regparse + 1;
      ender = regbranch((int *)&local_40);
      if (ender == (char *)0x0) {
        return (char *)0x0;
      }
      regtail(br,ender);
      if ((local_40 & 1) == 0) {
        *(uint *)ret = *(uint *)ret & 0xfffffffe;
      }
      *(uint *)ret = local_40 & 4 | *(uint *)ret;
    }
    if (flagp_local._4_4_ == 0) {
      local_44 = '\0';
    }
    else {
      local_44 = (char)local_3c + '\x1e';
    }
    _flags = regnode(local_44);
    regtail(br,_flags);
    for (ender = br; ender != (char *)0x0; ender = regnext(ender)) {
      regoptail(ender,_flags);
    }
    if ((flagp_local._4_4_ == 0) ||
       (pcVar2 = regparse + 1, cVar1 = *regparse, regparse = pcVar2, cVar1 == ')')) {
      if ((flagp_local._4_4_ == 0) && (*regparse != '\0')) {
        if (*regparse == ')') {
          printf("RegularExpression::compile(): Unmatched parentheses.\n");
          pcStack_10 = (char *)0x0;
        }
        else {
          printf("RegularExpression::compile(): Internal error.\n");
          pcStack_10 = (char *)0x0;
        }
      }
      else {
        pcStack_10 = br;
      }
    }
    else {
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      pcStack_10 = (char *)0x0;
    }
  }
  return pcStack_10;
}

Assistant:

static char* reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpression::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return 0;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = 0;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == 0)
    return (0);
  if (ret != 0)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == 0)
      return (0);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != 0; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return 0;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return 0;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return 0;
    }
    // NOTREACHED
  }
  return (ret);
}